

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PopButtonRepeat(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  uint uVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  iVar1 = (pIVar2->DC).ButtonRepeatStack.Size;
  if (0 < iVar1) {
    uVar4 = iVar1 - 1;
    (pIVar2->DC).ButtonRepeatStack.Size = uVar4;
    if (uVar4 == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = (pIVar2->DC).ButtonRepeatStack.Data[(ulong)uVar4 - 1];
    }
    (pIVar2->DC).ButtonRepeat = bVar3;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x370,"void ImVector<bool>::pop_back() [T = bool]");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }